

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

QByteArray * __thiscall
QTimeZonePrivate::aliasToIana
          (QByteArray *__return_storage_ptr__,QTimeZonePrivate *this,QByteArrayView alias)

{
  _func_int ***ppp_Var1;
  long lVar2;
  int iVar3;
  QTimeZonePrivate *pQVar4;
  difference_type __d;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 *puVar9;
  
  uVar6 = 0x9a;
  puVar9 = QtTimeZoneCldr::aliasMappingTable;
  do {
    uVar5 = uVar6 >> 1;
    uVar7 = (ulong)*(ushort *)((long)puVar9 + uVar5 * 2 * 2);
    lVar8 = -1;
    do {
      lVar2 = lVar8 + uVar7 + 1;
      lVar8 = lVar8 + 1;
    } while ("Africa/Asmera"[lVar2] != '\0');
    iVar3 = qstrnicmp("Africa/Asmera" + uVar7,lVar8,(char *)alias.m_size,(qsizetype)this);
    uVar7 = uVar6 + ~uVar5;
    uVar6 = uVar5;
    if (iVar3 < 0) {
      puVar9 = (undefined1 *)((ushort *)((long)puVar9 + uVar5 * 2 * 2) + 2);
      uVar6 = uVar7;
    }
  } while (0 < (long)uVar6);
  if (puVar9 != &DAT_005973e8) {
    pQVar4 = (QTimeZonePrivate *)0xffffffffffffffff;
    do {
      ppp_Var1 = &pQVar4->_vptr_QTimeZonePrivate;
      pQVar4 = (QTimeZonePrivate *)((long)&pQVar4->_vptr_QTimeZonePrivate + 1);
    } while ("Africa/Asmera"[(long)ppp_Var1 + (ulong)*(ushort *)puVar9 + 1] != '\0');
    if ((this == pQVar4) &&
       ((this == (QTimeZonePrivate *)0x0 ||
        (iVar3 = bcmp("Africa/Asmera" + *(ushort *)puVar9,(char *)alias.m_size,(size_t)this),
        iVar3 == 0)))) {
      lVar8 = -1;
      do {
        lVar2 = lVar8 + (ulong)*(ushort *)((long)puVar9 + 2) + 1;
        lVar8 = lVar8 + 1;
      } while ("Africa/Asmera"[lVar2] != '\0');
      QByteArray::QByteArray
                (__return_storage_ptr__,"Africa/Asmera" + *(ushort *)((long)puVar9 + 2),lVar8);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QByteArray QTimeZonePrivate::aliasToIana(QByteArrayView alias)
{
    const auto data = std::lower_bound(std::begin(aliasMappingTable), std::end(aliasMappingTable),
                                       alias, earlierAliasId);
    if (data != std::end(aliasMappingTable) && data->aliasId() == alias)
        return data->ianaId().toByteArray();
    // Note: empty return means not an alias, which is true of an ID that others
    // are aliases to, as the table omits self-alias entries. Let caller sort
    // that out, rather than allocating to return alias.toByteArray().
    return {};
}